

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void mbedtls_ssl_sig_hash_set_add
               (mbedtls_ssl_sig_hash_set_t *set,mbedtls_pk_type_t sig_alg,mbedtls_md_type_t md_alg)

{
  if (sig_alg == MBEDTLS_PK_ECDSA) {
    if (set->ecdsa != MBEDTLS_MD_NONE) {
      return;
    }
    set = (mbedtls_ssl_sig_hash_set_t *)&set->ecdsa;
  }
  else if ((sig_alg != MBEDTLS_PK_RSA) || (set->rsa != MBEDTLS_MD_NONE)) {
    return;
  }
  set->rsa = md_alg;
  return;
}

Assistant:

void mbedtls_ssl_sig_hash_set_add( mbedtls_ssl_sig_hash_set_t *set,
                                   mbedtls_pk_type_t sig_alg,
                                   mbedtls_md_type_t md_alg )
{
    switch( sig_alg )
    {
        case MBEDTLS_PK_RSA:
            if( set->rsa == MBEDTLS_MD_NONE )
                set->rsa = md_alg;
            break;

        case MBEDTLS_PK_ECDSA:
            if( set->ecdsa == MBEDTLS_MD_NONE )
                set->ecdsa = md_alg;
            break;

        default:
            break;
    }
}